

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image.h
# Opt level: O0

stbi_uc * stbi__resample_row_generic(stbi_uc *out,stbi_uc *in_near,stbi_uc *in_far,int w,int hs)

{
  int local_30;
  int local_2c;
  int j;
  int i;
  int hs_local;
  int w_local;
  stbi_uc *in_far_local;
  stbi_uc *in_near_local;
  stbi_uc *out_local;
  
  for (local_2c = 0; local_2c < w; local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < hs; local_30 = local_30 + 1) {
      out[local_2c * hs + local_30] = in_near[local_2c];
    }
  }
  return out;
}

Assistant:

static stbi_uc *stbi__resample_row_generic(stbi_uc *out, stbi_uc *in_near, stbi_uc *in_far, int w, int hs)
{
   // resample with nearest-neighbor
   int i,j;
   STBI_NOTUSED(in_far);
   for (i=0; i < w; ++i)
      for (j=0; j < hs; ++j)
         out[i*hs+j] = in_near[i];
   return out;
}